

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

lys_type * lyp_get_next_union_type(lys_type *type,lys_type *prev_type,int *found)

{
  lys_tpdf **pplVar1;
  lys_type_bit *plVar2;
  uint uVar3;
  lys_type *plVar4;
  ulong uVar5;
  long lVar6;
  
  while (uVar3 = (type->info).bits.count, uVar3 == 0) {
    pplVar1 = &type->der;
    type = &(*pplVar1)->type;
    if (*pplVar1 == (lys_tpdf *)0x0) {
      __assert_fail("type->der",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x7b2,
                    "struct lys_type *lyp_get_next_union_type(struct lys_type *, struct lys_type *, int *)"
                   );
    }
  }
  lVar6 = 0;
  uVar5 = 0;
  do {
    if (uVar3 <= uVar5) {
      return (lys_type *)0x0;
    }
    plVar2 = (type->info).bits.bit;
    plVar4 = (lys_type *)((long)&plVar2->name + lVar6);
    if (*(int *)((long)&plVar2->name + lVar6) == 0xb) {
      plVar4 = lyp_get_next_union_type(plVar4,prev_type,found);
      if (plVar4 != (lys_type *)0x0) {
        return plVar4;
      }
    }
    else {
      if (prev_type == (lys_type *)0x0) {
        return (lys_type *)((long)plVar2 + uVar5 * 0x40);
      }
      if (*found != 0) {
        return plVar4;
      }
      if (plVar4 == prev_type) {
        *found = 1;
      }
    }
    uVar5 = uVar5 + 1;
    uVar3 = (type->info).bits.count;
    lVar6 = lVar6 + 0x40;
  } while( true );
}

Assistant:

struct lys_type *
lyp_get_next_union_type(struct lys_type *type, struct lys_type *prev_type, int *found)
{
    unsigned int i;
    struct lys_type *ret = NULL;

    while (!type->info.uni.count) {
        assert(type->der); /* at least the direct union type has to have type specified */
        type = &type->der->type;
    }

    for (i = 0; i < type->info.uni.count; ++i) {
        if (type->info.uni.types[i].base == LY_TYPE_UNION) {
            ret = lyp_get_next_union_type(&type->info.uni.types[i], prev_type, found);
            if (ret) {
                break;
            }
            continue;
        }

        if (!prev_type || *found) {
            ret = &type->info.uni.types[i];
            break;
        }

        if (&type->info.uni.types[i] == prev_type) {
            *found = 1;
        }
    }

    return ret;
}